

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
::
TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
          (TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
           *this)

{
  TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test
  *this_local;
  
  memset(this,0,0x30);
  TEST_GROUP_CppUTestGroupMockExpectedCallsList::TEST_GROUP_CppUTestGroupMockExpectedCallsList
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_MockExpectedCallsList_hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters_Test_0032a570
  ;
  return;
}

Assistant:

TEST(MockExpectedCallsList, hasFinalizedMatchingExpectations_listHasFinalizedCallThatIgnoresParameters)
{
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    call1->ignoreOtherParameters();
    call2->withParameter("param", 0);

    call1->finalizeActualCallMatch();

    CHECK(list->hasFinalizedMatchingExpectations());
}